

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example007_random_generator.cpp
# Opt level: O3

bool local_random::generate<unsigned_short,void>(void)

{
  long lVar1;
  long lVar2;
  unsigned_long uVar3;
  wide_integer_type n;
  random_engine_type generator;
  undefined1 local_a48 [32];
  result_type local_a28;
  uniform_int_distribution<256u,unsigned_int,void,false> local_a08 [16];
  undefined1 local_9f8 [16];
  undefined4 local_9e8;
  undefined4 uStack_9e4;
  undefined4 uStack_9e0;
  undefined4 uStack_9dc;
  undefined4 local_9d8;
  undefined4 uStack_9d4;
  undefined4 uStack_9d0;
  undefined4 uStack_9cc;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  local_9c8;
  
  local_9c8._M_x[0] = 0x1571;
  lVar1 = 1;
  uVar3 = 0x1571;
  do {
    uVar3 = (uVar3 >> 0x3e ^ uVar3) * 0x5851f42d4c957f2d + lVar1;
    local_9c8._M_x[lVar1] = uVar3;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x138);
  local_9c8._M_p = 0x138;
  local_9f8 = (undefined1  [16])0x0;
  local_a08[0] = (uniform_int_distribution<256u,unsigned_int,void,false>)0x0;
  local_a08[1] = (uniform_int_distribution<256u,unsigned_int,void,false>)0x0;
  local_a08[2] = (uniform_int_distribution<256u,unsigned_int,void,false>)0x0;
  local_a08[3] = (uniform_int_distribution<256u,unsigned_int,void,false>)0x0;
  local_a08[4] = (uniform_int_distribution<256u,unsigned_int,void,false>)0x0;
  local_a08[5] = (uniform_int_distribution<256u,unsigned_int,void,false>)0x0;
  local_a08[6] = (uniform_int_distribution<256u,unsigned_int,void,false>)0x0;
  local_a08[7] = (uniform_int_distribution<256u,unsigned_int,void,false>)0x0;
  local_a08[8] = (uniform_int_distribution<256u,unsigned_int,void,false>)0x0;
  local_a08[9] = (uniform_int_distribution<256u,unsigned_int,void,false>)0x0;
  local_a08[10] = (uniform_int_distribution<256u,unsigned_int,void,false>)0x0;
  local_a08[0xb] = (uniform_int_distribution<256u,unsigned_int,void,false>)0x0;
  local_a08[0xc] = (uniform_int_distribution<256u,unsigned_int,void,false>)0x0;
  local_a08[0xd] = (uniform_int_distribution<256u,unsigned_int,void,false>)0x0;
  local_a08[0xe] = (uniform_int_distribution<256u,unsigned_int,void,false>)0x0;
  local_a08[0xf] = (uniform_int_distribution<256u,unsigned_int,void,false>)0x0;
  local_9e8 = 0xffffffff;
  uStack_9e4 = 0xffffffff;
  uStack_9e0 = 0xffffffff;
  uStack_9dc = 0xffffffff;
  local_9d8 = 0xffffffff;
  uStack_9d4 = 0xffffffff;
  uStack_9d0 = 0xffffffff;
  uStack_9cc = 0xffffffff;
  math::wide_integer::uniform_int_distribution<256u,unsigned_int,void,false>::
  generate<std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>,64>
            (&local_a28,local_a08,&local_9c8,(param_type *)local_a08);
  local_a48._16_16_ = (undefined1  [16])0x0;
  local_a48._0_16_ = (undefined1  [16])0x0;
  math::wide_integer::uintwide_t<256U,_unsigned_int,_void,_false>::rd_string
            ((uintwide_t<256U,_unsigned_int,_void,_false> *)local_a48,
             "0xF258D22D4DB91392B5EE8CB6ABE457F8401F7AC78BC80F1CC96D191CF6F6AEA6",0xffffffffffffffff
             ,0);
  lVar1 = 0x1c;
  do {
    lVar2 = lVar1;
    if (lVar2 == -4) break;
    lVar1 = lVar2 + -4;
  } while (*(int *)((long)local_a28.values.super_array<unsigned_int,_8UL>.elems + lVar2) ==
           *(int *)(local_a48 + lVar2));
  return lVar2 == -4;
}

Assistant:

auto generate() -> bool
  {
    using random_engine_type = std::mersenne_twister_engine<std::uint64_t,
                                                            static_cast<std::size_t>(UINT32_C( 64)),
                                                            static_cast<std::size_t>(UINT32_C(312)),
                                                            static_cast<std::size_t>(UINT32_C(156)),
                                                            static_cast<std::size_t>(UINT32_C( 31)),
                                                            UINT64_C(0xB5026F5AA96619E9),
                                                            static_cast<std::size_t>(UINT32_C( 29)),
                                                            UINT64_C(0x5555555555555555),
                                                            static_cast<std::size_t>(UINT32_C( 17)),
                                                            UINT64_C(0x71D67FFFEDA60000),
                                                            static_cast<std::size_t>(UINT32_C( 37)),
                                                            UINT64_C(0xFFF7EEE000000000),
                                                            static_cast<std::size_t>(UINT32_C( 43)),
                                                            UINT64_C(6364136223846793005)>;

    #if defined(WIDE_INTEGER_NAMESPACE)
    using wide_integer_type  = WIDE_INTEGER_NAMESPACE::math::wide_integer::uintwide_t<static_cast<WIDE_INTEGER_NAMESPACE::math::wide_integer::size_t>(UINT32_C(256)), std::uint32_t, AllocatorType>;
    using distribution_type  = WIDE_INTEGER_NAMESPACE::math::wide_integer::uniform_int_distribution<wide_integer_type::my_width2, typename wide_integer_type::limb_type>;
    #else
    using wide_integer_type  = ::math::wide_integer::uintwide_t<static_cast<math::wide_integer::size_t>(UINT32_C(256)), std::uint32_t, AllocatorType>;
    using distribution_type  = ::math::wide_integer::uniform_int_distribution<wide_integer_type::my_width2, typename wide_integer_type::limb_type>;
    #endif

    // Generate a random number with wide_integer_type having limbs of type LimbType.
    // Purosely use the default seed.
    random_engine_type generator; // NOLINT(cert-msc32-c,cert-msc51-cpp)

    distribution_type distribution { };

    const wide_integer_type n = distribution(generator);

    const auto result_is_ok =
      (n == wide_integer_type("0xF258D22D4DB91392B5EE8CB6ABE457F8401F7AC78BC80F1CC96D191CF6F6AEA6"));

    return result_is_ok;
  }